

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCheckTimestepper(ARKodeMem ark_mem)

{
  ARKodeMem ark_mem_local;
  int local_4;
  
  if ((((ark_mem->step_init == (ARKTimestepInitFn)0x0) || (ark_mem->step == (ARKTimestepStepFn)0x0))
      || (ark_mem->step_mem == (void *)0x0)) || (ark_mem->step_fullrhs == (ARKTimestepFullRHSFn)0x0)
     ) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

booleantype arkCheckTimestepper(ARKodeMem ark_mem)
{
  if ( (ark_mem->step_init    == NULL) ||
       (ark_mem->step         == NULL) ||
       (ark_mem->step_mem     == NULL) ||
       (ark_mem->step_fullrhs == NULL) )
    return(SUNFALSE);
  return(SUNTRUE);
}